

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O1

TimingOf<std::chrono::_V2::system_clock,_std::vector<double>_(*&(int_&))(int)> * __thiscall
nonius::detail::
measure<std::chrono::_V2::system_clock,std::vector<double,std::allocator<double>>(*&)(int),int&>
          (TimingOf<std::chrono::_V2::system_clock,_std::vector<double>_(*&(int_&))(int)>
           *__return_storage_ptr__,detail *this,
          _func_vector<double,_std::allocator<double>_>_int **fun,int *args)

{
  long lVar1;
  long lVar2;
  vector<double,_std::allocator<double>_> local_58;
  pointer local_38;
  pointer pdStack_30;
  pointer local_28;
  
  lVar1 = std::chrono::_V2::system_clock::now();
  (**(code **)this)(&local_38,*(undefined4 *)fun);
  lVar2 = std::chrono::_V2::system_clock::now();
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = local_38;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = pdStack_30;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_28;
  local_38 = (pointer)0x0;
  pdStack_30 = (pointer)0x0;
  local_28 = (pointer)0x0;
  (__return_storage_ptr__->elapsed).__r = lVar2 - lVar1;
  std::vector<double,_std::allocator<double>_>::vector(&__return_storage_ptr__->result,&local_58);
  __return_storage_ptr__->iterations = 1;
  if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_38 != (pointer)0x0) {
    operator_delete(local_38,(long)local_28 - (long)local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

TimingOf<Clock, Fun(Args...)> measure(Fun&& fun, Args&&... args) {
            auto start = Clock::now();
            auto&& r = detail::complete_invoke(fun, std::forward<Args>(args)...);
            auto end = Clock::now();
            auto delta = end - start;
            return { delta, std::forward<decltype(r)>(r), 1 };
        }